

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_interface.c
# Opt level: O0

void * print_new(t_symbol *sel,int argc,t_atom *argv)

{
  int iVar1;
  t_symbol *ptVar2;
  _binbuf *x_00;
  _binbuf *bb;
  char *buf;
  t_symbol *ptStack_30;
  int bufsize;
  t_symbol *s;
  t_print_conflict *x;
  t_atom *argv_local;
  t_symbol *ptStack_10;
  int argc_local;
  t_symbol *sel_local;
  
  x = (t_print_conflict *)argv;
  argv_local._4_4_ = argc;
  ptStack_10 = sel;
  s = (t_symbol *)pd_new(print_class);
  if (argv_local._4_4_ == 0) {
    ptVar2 = gensym("print");
    s[2].s_name = (char *)ptVar2;
  }
  else if ((argv_local._4_4_ == 1) && (*(int *)&(x->x_obj).te_g.g_pd == 2)) {
    ptStack_30 = atom_getsymbolarg(0,1,(t_atom *)x);
    iVar1 = strcmp(ptStack_30->s_name,"-n");
    if (iVar1 == 0) {
      s[2].s_name = (char *)&s_;
    }
    else {
      s[2].s_name = (char *)ptStack_30;
    }
  }
  else {
    x_00 = binbuf_new();
    binbuf_add(x_00,argv_local._4_4_,(t_atom *)x);
    binbuf_gettext(x_00,(char **)&bb,(int *)((long)&buf + 4));
    bb = (_binbuf *)resizebytes(bb,(long)buf._4_4_,(long)(buf._4_4_ + 1));
    *(char *)((long)&bb->b_n + (long)buf._4_4_) = '\0';
    ptVar2 = gensym((char *)bb);
    s[2].s_name = (char *)ptVar2;
    freebytes(bb,(long)(buf._4_4_ + 1));
    binbuf_free(x_00);
  }
  return s;
}

Assistant:

static void *print_new(t_symbol *sel, int argc, t_atom *argv)
{
    t_print *x = (t_print *)pd_new(print_class);
    if (argc == 0)
        x->x_sym = gensym("print");
    else if (argc == 1 && argv->a_type == A_SYMBOL)
    {
        t_symbol *s = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(s->s_name, "-n"))
            x->x_sym = &s_;
        else x->x_sym = s;
    }
    else
    {
        int bufsize;
        char *buf;
        t_binbuf *bb = binbuf_new();
        binbuf_add(bb, argc, argv);
        binbuf_gettext(bb, &buf, &bufsize);
        buf = resizebytes(buf, bufsize, bufsize+1);
        buf[bufsize] = 0;
        x->x_sym = gensym(buf);
        freebytes(buf, bufsize+1);
        binbuf_free(bb);
    }
    return (x);
}